

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::Promise<unsigned_long>_>::setCapacity
          (Vector<kj::Promise<unsigned_long>_> *this,size_t newSize)

{
  __off_t in_RDX;
  ArrayBuilder<kj::Promise<unsigned_long>_> newBuilder;
  ArrayBuilder<kj::Promise<unsigned_long>_> local_30;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 3)) {
    ArrayBuilder<kj::Promise<unsigned_long>_>::truncate(&this->builder,(char *)newSize,in_RDX);
  }
  local_30.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::Promise<unsigned_long>>
                           (newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<kj::Promise<unsigned_long>>::addAll<kj::ArrayBuilder<kj::Promise<unsigned_long>>>
            ((ArrayBuilder<kj::Promise<unsigned_long>> *)&local_30,&this->builder);
  ArrayBuilder<kj::Promise<unsigned_long>_>::operator=(&this->builder,&local_30);
  ArrayBuilder<kj::Promise<unsigned_long>_>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }